

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void OutputCompilerStatistics(CompilerStatistics *statistics,uint outerTotalMicros)

{
  uint uVar1;
  Timer *pTVar2;
  uint i;
  uint index;
  OutputContext outputCtx;
  OutputContext local_270;
  
  local_270.outputBuf = local_270.outputBufDef;
  local_270.outputBufSize = 0x100;
  local_270.outputBufPos = 0;
  local_270.tempBuf = local_270.tempBufDef;
  local_270.tempBufSize = 0x100;
  local_270.stream = (void *)0x0;
  local_270.openStream = OutputContext::FileOpen;
  local_270.writeStream = OutputContext::FileWrite;
  local_270.closeStream = OutputContext::FileClose;
  local_270.stream = OutputContext::FileOpen("time_stats.txt");
  local_270.writeStream = OutputContext::FileWrite;
  uVar1 = CompilerStatistics::Total(statistics);
  for (index = 0; index < (statistics->timers).count; index = index + 1) {
    pTVar2 = SmallArray<CompilerStatistics::Timer,_16U>::operator[](&statistics->timers,index);
    OutputContext::Printf
              (&local_270,"%15s %6dms (%3d%%)\n",(pTVar2->outputName).begin,
               (ulong)pTVar2->total / 1000,
               (ulong)(uint)(int)(((double)pTVar2->total * 100.0) / (double)uVar1));
  }
  OutputContext::Printf
            (&local_270,"%15s %6dms (%6dms)\n","total",(ulong)uVar1 / 1000,
             (ulong)outerTotalMicros / 1000);
  if (local_270.outputBufPos != 0) {
    (*local_270.writeStream)(local_270.stream,local_270.outputBuf,local_270.outputBufPos);
  }
  local_270._264_8_ = local_270._264_8_ & 0xffffffff;
  fclose((FILE *)local_270.stream);
  local_270.stream = (void *)0x0;
  OutputContext::~OutputContext(&local_270);
  return;
}

Assistant:

void OutputCompilerStatistics(CompilerStatistics &statistics, unsigned outerTotalMicros)
{
	OutputContext outputCtx;

	outputCtx.stream = OutputContext::FileOpen("time_stats.txt");
	outputCtx.writeStream = OutputContext::FileWrite;

	unsigned total = statistics.Total();

	for(unsigned i = 0; i < statistics.timers.size(); i++)
	{
		CompilerStatistics::Timer &timer = statistics.timers[i];

		outputCtx.Printf("%15s %6dms (%3d%%)\n", timer.outputName.begin, timer.total / 1000, int(timer.total * 100.0 / total));
	}

	outputCtx.Printf("%15s %6dms (%6dms)\n", "total", total / 1000, outerTotalMicros / 1000);

	outputCtx.Flush();

	OutputContext::FileClose(outputCtx.stream);
	outputCtx.stream = NULL;
}